

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::Marray<unsigned_char,_std::allocator<unsigned_long>_>::Marray
          (Marray<unsigned_char,_std::allocator<unsigned_long>_> *this,uchar *value,
          CoordinateOrder *coordinateOrder,allocator_type *allocator)

{
  uchar *puVar1;
  allocator_type local_51;
  Geometry<std::allocator<unsigned_long>_> local_50;
  
  View<unsigned_char,_false,_std::allocator<unsigned_long>_>::View
            (&this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>,
             (allocator_type *)&local_50);
  puVar1 = (uchar *)operator_new(1);
  (this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).data_ = puVar1;
  *puVar1 = *value;
  marray_detail::Geometry<std::allocator<unsigned_long>_>::Geometry
            (&local_50,0,coordinateOrder,1,true,&local_51);
  marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
            (&(this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).geometry_,
             &local_50);
  marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&local_50);
  testInvariant(this);
  return;
}

Assistant:

inline
Marray<T, A>::Marray
(
    const T& value,
    const CoordinateOrder& coordinateOrder,
    const allocator_type& allocator
) 
:   dataAllocator_(allocator)
{
    this->data_ = dataAllocator_.allocate(1);
    this->data_[0] = value;
    this->geometry_ = geometry_type(0, coordinateOrder, 1, true, allocator);
    testInvariant();
}